

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

Formula * Lib::List<Kernel::Formula_*>::pop(List<Kernel::Formula_*> **lst)

{
  List<Kernel::Formula_*> *ptr;
  Formula *pFVar1;
  List<Kernel::Formula_*> *pLVar2;
  
  ptr = *lst;
  pFVar1 = ptr->_head;
  pLVar2 = ptr->_tail;
  List<Kernel::Formula*>::operator_delete(ptr,0x10);
  *lst = pLVar2;
  return pFVar1;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }